

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O3

MIPSCPU_conflict2 * cpu_mips_init_mips64(uc_struct_conflict6 *uc)

{
  MIPSCPU_conflict2 *cs;
  MIPSCPU_conflict2 *cpu;
  
  cs = (MIPSCPU_conflict2 *)calloc(1,0xccc0);
  if (cs == (MIPSCPU_conflict2 *)0x0) {
LAB_00891059:
    cs = (MIPSCPU_conflict2 *)0x0;
  }
  else {
    if (uc->cpu_model == 0x7fffffff) {
      uc->cpu_model = 0;
    }
    else if (0x1c < uc->cpu_model + 0x10) {
      free(cs);
      goto LAB_00891059;
    }
    (cs->parent_obj).cc = &(cs->cc).parent_class;
    (cs->parent_obj).uc = (uc_struct_conflict7 *)uc;
    uc->cpu = (CPUState *)cs;
    cpu_class_init((uc_struct *)uc,&(cs->cc).parent_class);
    (cs->cc).parent_reset = (_func_void_CPUState_ptr *)(cs->cc).parent_class.reset;
    (cs->cc).parent_class.reset = mips_cpu_reset;
    (cs->cc).parent_class.has_work = mips_cpu_has_work;
    (cs->cc).parent_class.do_interrupt = mips_cpu_do_interrupt_mips64;
    (cs->cc).parent_class.cpu_exec_interrupt = mips_cpu_exec_interrupt_mips64;
    (cs->cc).parent_class.set_pc = mips_cpu_set_pc;
    (cs->cc).parent_class.synchronize_from_tb = mips_cpu_synchronize_from_tb;
    (cs->cc).parent_class.do_unaligned_access = mips_cpu_do_unaligned_access_mips64;
    (cs->cc).parent_class.get_phys_page_debug = mips_cpu_get_phys_page_debug_mips64;
    (cs->cc).parent_class.tcg_initialize = mips_tcg_init_mips64;
    (cs->cc).parent_class.tlb_fill_cpu = mips_cpu_tlb_fill_mips64;
    cpu_common_initfn((uc_struct *)uc,(CPUState *)cs);
    (cs->env).uc = (uc_struct_conflict5 *)uc;
    (cs->parent_obj).env_ptr = &cs->env;
    (cs->parent_obj).icount_decr_ptr = &(cs->neg).icount_decr;
    (cs->env).cpu_model = mips_defs_mips64 + uc->cpu_model;
    cpu_exec_realizefn_mips64((CPUState *)cs);
    cpu_mips_realize_env_mips64(&cs->env);
    cpu_reset((CPUState *)cs);
    cpu_address_space_init_mips64((CPUState *)cs,0,(cs->parent_obj).memory);
    qemu_init_vcpu_mips64((CPUState *)cs);
  }
  return cs;
}

Assistant:

MIPSCPU *cpu_mips_init(struct uc_struct *uc)
{
    MIPSCPU *cpu;
    CPUState *cs;
    CPUClass *cc;
    CPUMIPSState *env;

    cpu = calloc(1, sizeof(*cpu));
    if (cpu == NULL) {
        return NULL;
    }

#ifdef TARGET_MIPS64
    if (uc->cpu_model == INT_MAX) {
        uc->cpu_model = UC_CPU_MIPS64_R4000; // R4000
    } else if (uc->cpu_model + UC_CPU_MIPS32_I7200 + 1 >= mips_defs_number ) {
        free(cpu);
        return NULL;
    }
#else
    if (uc->cpu_model == INT_MAX) {
        uc->cpu_model = UC_CPU_MIPS32_74KF; // 74kf
    } else if (uc->cpu_model >= mips_defs_number) {
        free(cpu);
        return NULL;
    }
#endif

    cs = (CPUState *)cpu;
    cc = (CPUClass *)&cpu->cc;
    cs->cc = cc;
    cs->uc = uc;
    uc->cpu = cs;

    cpu_class_init(uc, cc);

    mips_cpu_class_init(cc);

    cpu_common_initfn(uc, cs);

    mips_cpu_initfn(uc, cs);

    env = &cpu->env;
    env->cpu_model = &(mips_defs[uc->cpu_model]);

    if (env->cpu_model == NULL) {
        free(cpu);
        return NULL;
    }

    mips_cpu_realizefn(cs);

    // init address space
    cpu_address_space_init(cs, 0, cs->memory);

    qemu_init_vcpu(cs);

    return cpu;
}